

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O1

string * __thiscall
IndividualBeliefJESP::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,IndividualBeliefJESP *this)

{
  pointer puVar1;
  uint uVar2;
  ostream *poVar3;
  pointer puVar4;
  double dVar5;
  stringstream ss;
  stringstream ss_1;
  ulong local_548;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_538;
  long *local_520;
  long local_518;
  long local_510 [2];
  long *local_500;
  long local_4f8;
  long local_4f0 [2];
  ios_base *local_4e0;
  string *local_4d8;
  ostream *local_4d0;
  void *local_4c8;
  void *local_4c0;
  long local_4b8 [14];
  ios_base local_448 [264];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_340);
  local_4e0 = aiStack_138;
  local_548 = 0;
  local_4d8 = __return_storage_ptr__;
  while( true ) {
    uVar2 = (**(code **)(*(long *)&this->super_Belief + 0x70))();
    if (uVar2 <= local_548) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_340);
      std::ios_base::~ios_base(local_2c0);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_330,"eI=",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",[sI=",5);
    IndexTools::JointToIndividualIndicesStepSize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4c8,(Index)local_548,
               this->_m_stepsizeSJOH,2);
    if (local_4c0 == local_4c8) break;
    operator_delete(local_4c8,local_4b8[0] - (long)local_4c8);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    GetOthersObservationHistIndex(&local_538,this,(Index)local_548);
    local_4d0 = poVar3;
    std::__cxx11::stringstream::stringstream(local_1b8);
    puVar1 = local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"< ",2);
    for (; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      if (puVar4 != local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&local_4c8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_4c8);
      std::ios_base::~ios_base(local_448);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_500,local_4f8);
      if (local_500 != local_4f0) {
        operator_delete(local_500,local_4f0[0] + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," >",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_4e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_4d0,(char *)local_520,local_518);
    __return_storage_ptr__ = local_4d8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ] - p=",7);
    dVar5 = (double)(**(code **)(*(long *)&this->super_Belief + 0x48))(this,local_548);
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_520 != local_510) {
      operator_delete(local_520,local_510[0] + 1);
    }
    if (local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_538.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_538.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_548 = local_548 + 1;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

string IndividualBeliefJESP::SoftPrint() const
{
    stringstream ss;
    for(Index eI=0; eI < Size(); eI++)
    {
        ss << "eI="<<eI<<",[sI="<<GetStateIndex(eI) << ", " <<
            SoftPrintVector(GetOthersObservationHistIndex(eI)) << " ] - p=" <<
            Get(eI) << endl;
    }
    return (ss.str());
}